

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Term.cpp
# Opt level: O0

bool __thiscall Kernel::TermList::containsAllVariablesOf(TermList *this,TermList t)

{
  TermList val;
  bool bVar1;
  TermIterator newVars;
  TermIterator oldVars;
  Set<Kernel::TermList,_Lib::DefaultHash> vars;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  TermList in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  TermList in_stack_ffffffffffffff50;
  TermList in_stack_ffffffffffffff58;
  TermList in_stack_ffffffffffffff78;
  bool local_1;
  
  Lib::Set<Kernel::TermList,_Lib::DefaultHash>::Set
            ((Set<Kernel::TermList,_Lib::DefaultHash> *)0x982bb1);
  Term::getVariableIterator(in_stack_ffffffffffffff78);
  while (bVar1 = Lib::VirtualIterator<Kernel::TermList>::hasNext
                           ((VirtualIterator<Kernel::TermList> *)0x982be1), bVar1) {
    in_stack_ffffffffffffff58 =
         Lib::VirtualIterator<Kernel::TermList>::next
                   ((VirtualIterator<Kernel::TermList> *)
                    CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
    val._content._7_1_ = in_stack_ffffffffffffff4f;
    val._content._0_7_ = in_stack_ffffffffffffff48;
    in_stack_ffffffffffffff50 =
         Lib::Set<Kernel::TermList,_Lib::DefaultHash>::insert
                   (in_stack_ffffffffffffff40._content,val);
  }
  Term::getVariableIterator(in_stack_ffffffffffffff78);
  do {
    bVar1 = Lib::VirtualIterator<Kernel::TermList>::hasNext
                      ((VirtualIterator<Kernel::TermList> *)0x982c84);
    if (!bVar1) {
      local_1 = true;
      goto LAB_00982d12;
    }
    in_stack_ffffffffffffff40 =
         Lib::VirtualIterator<Kernel::TermList>::next
                   ((VirtualIterator<Kernel::TermList> *)
                    CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
    in_stack_ffffffffffffff3f =
         Lib::Set<Kernel::TermList,_Lib::DefaultHash>::contains
                   ((Set<Kernel::TermList,_Lib::DefaultHash> *)in_stack_ffffffffffffff50._content,
                    in_stack_ffffffffffffff58);
  } while ((bool)in_stack_ffffffffffffff3f);
  local_1 = false;
LAB_00982d12:
  Lib::VirtualIterator<Kernel::TermList>::~VirtualIterator
            ((VirtualIterator<Kernel::TermList> *)in_stack_ffffffffffffff40._content);
  Lib::VirtualIterator<Kernel::TermList>::~VirtualIterator
            ((VirtualIterator<Kernel::TermList> *)in_stack_ffffffffffffff40._content);
  Lib::Set<Kernel::TermList,_Lib::DefaultHash>::~Set
            ((Set<Kernel::TermList,_Lib::DefaultHash> *)in_stack_ffffffffffffff40._content);
  return local_1;
}

Assistant:

bool TermList::containsAllVariablesOf(TermList t) const
{
  Set<TermList> vars;
  TermIterator oldVars=Term::getVariableIterator(*this);
  while (oldVars.hasNext()) {
    vars.insert(oldVars.next());
  }
  TermIterator newVars=Term::getVariableIterator(t);
  while (newVars.hasNext()) {
    if (!vars.contains(newVars.next())) {
      return false;
    }
  }
  return true;
}